

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void iffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [12];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  long StageCnt;
  long NDiffU;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float scale;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  long lStack_60;
  
  auVar7 = _DAT_00105240;
  auVar6 = _DAT_00105200;
  auVar5 = _DAT_00105160;
  auVar2 = _DAT_001050e0;
  scale = (float)(double)(0x3ff0000000000000 - (M << 0x34));
  switch(M) {
  case 0:
    break;
  case 1:
    while (0 < Rows) {
      auVar2 = *(undefined1 (*) [16])ioptr;
      Rows = Rows + -1;
      auVar25 = vshufpd_avx(auVar2,auVar2,1);
      auVar27 = vsubps_avx(auVar25,auVar2);
      *(float *)*(undefined1 (*) [16])ioptr = (auVar25._0_4_ + auVar2._0_4_) * scale;
      *(float *)(*(undefined1 (*) [16])ioptr + 4) = (auVar25._4_4_ + auVar2._4_4_) * scale;
      *(float *)(*(undefined1 (*) [16])ioptr + 8) = auVar27._8_4_ * scale;
      *(float *)(*(undefined1 (*) [16])ioptr + 0xc) = auVar27._12_4_ * scale;
      ioptr = (float *)((long)ioptr + 0x10);
    }
    break;
  case 2:
    while (0 < Rows) {
      auVar3 = *(undefined1 (*) [32])ioptr;
      Rows = Rows + -1;
      auVar19 = vpermpd_avx2(auVar3,0x4e);
      auVar28._0_4_ = auVar3._0_4_ + auVar19._0_4_;
      auVar28._4_4_ = auVar3._4_4_ + auVar19._4_4_;
      auVar28._8_4_ = auVar3._8_4_ + auVar19._8_4_;
      auVar28._12_4_ = auVar3._12_4_ + auVar19._12_4_;
      auVar28._16_4_ = auVar3._16_4_ + auVar19._16_4_;
      auVar28._20_4_ = auVar3._20_4_ + auVar19._20_4_;
      auVar28._24_4_ = auVar3._24_4_ + auVar19._24_4_;
      auVar28._28_4_ = auVar3._28_4_ + auVar19._28_4_;
      auVar3 = vsubps_avx(auVar3,auVar19);
      auVar19 = vpermt2ps_avx512vl(auVar28,auVar5,auVar3);
      auVar3 = vpermpd_avx2(auVar19,0x4e);
      auVar26._0_4_ = auVar19._0_4_ + auVar3._0_4_;
      auVar26._4_4_ = auVar19._4_4_ + auVar3._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + auVar3._8_4_;
      auVar26._12_4_ = auVar19._12_4_ + auVar3._12_4_;
      auVar26._16_4_ = auVar19._16_4_ + auVar3._16_4_;
      auVar26._20_4_ = auVar19._20_4_ + auVar3._20_4_;
      auVar26._24_4_ = auVar19._24_4_ + auVar3._24_4_;
      auVar26._28_4_ = auVar19._28_4_ + auVar3._28_4_;
      auVar3 = vsubps_avx(auVar19,auVar3);
      auVar3 = vblendps_avx(auVar26,auVar3,0xb4);
      *(float *)*(undefined1 (*) [32])ioptr = auVar3._0_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 4) = auVar3._4_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 8) = auVar3._8_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 0xc) = auVar3._12_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 0x10) = auVar3._16_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 0x14) = auVar3._20_4_ * scale;
      *(float *)(*(undefined1 (*) [32])ioptr + 0x18) = auVar3._24_4_ * scale;
      *(int *)(*(undefined1 (*) [32])ioptr + 0x1c) = auVar3._28_4_;
      ioptr = (float *)((long)ioptr + 0x20);
    }
    break;
  case 3:
    auVar20 = vbroadcastss_avx512f(ZEXT416((uint)scale));
    auVar25._0_12_ = ZEXT412(0x40000000) << 0x40;
    auVar25._12_4_ = 0x40000000;
    auVar27._8_8_ = 0x500000000;
    auVar27._0_8_ = 0x500000000;
    auVar29._8_8_ = 0x400000000;
    auVar29._0_8_ = 0x400000000;
    while (0 < Rows) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x28);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 8);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x18);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x38);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x30);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x10);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)((long)*(undefined1 (*) [64])ioptr + 0x20);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)*(undefined1 (*) [64])ioptr;
      Rows = Rows + -1;
      auVar8 = vaddps_avx512vl(auVar14,auVar11);
      auVar17 = vsubps_avx(auVar11,auVar14);
      auVar14 = vsubps_avx(auVar35,auVar37);
      auVar9 = vaddps_avx512vl(auVar37,auVar35);
      auVar10 = vaddps_avx512vl(auVar31,auVar34);
      auVar31 = vsubps_avx(auVar34,auVar31);
      auVar11 = vaddps_avx512vl(auVar12,auVar13);
      auVar18 = vsubps_avx(auVar13,auVar12);
      auVar17 = vshufps_avx(auVar17,auVar17,0xe1);
      auVar31 = vshufps_avx(auVar31,auVar31,0xe1);
      auVar12 = vaddps_avx512vl(auVar10,auVar11);
      auVar13 = vaddps_avx512vl(auVar9,auVar8);
      auVar36._0_4_ = auVar17._0_4_ + auVar14._0_4_;
      auVar36._4_4_ = auVar17._4_4_ + auVar14._4_4_;
      auVar36._8_4_ = auVar17._8_4_ + auVar14._8_4_;
      auVar36._12_4_ = auVar17._12_4_ + auVar14._12_4_;
      auVar14 = vsubps_avx(auVar17,auVar14);
      auVar32._0_4_ = auVar18._0_4_ + auVar31._0_4_;
      auVar32._4_4_ = auVar18._4_4_ + auVar31._4_4_;
      auVar32._8_4_ = auVar18._8_4_ + auVar31._8_4_;
      auVar32._12_4_ = auVar18._12_4_ + auVar31._12_4_;
      auVar18 = vsubps_avx(auVar18,auVar31);
      auVar17 = vblendps_avx(auVar36,auVar14,2);
      auVar14 = vpermt2ps_avx512vl(auVar14,auVar2,auVar36);
      auVar31 = vblendps_avx(auVar32,auVar18,2);
      auVar33._0_4_ = auVar17._0_4_ * 0.70710677;
      auVar33._4_4_ = auVar17._4_4_ * 0.70710677;
      auVar33._8_4_ = auVar17._8_4_ * 0.70710677;
      auVar33._12_4_ = auVar17._12_4_ * 0.70710677;
      auVar11 = vmovlhps_avx512f(auVar11,auVar31);
      auVar16._0_4_ = auVar14._0_4_ * 0.70710677;
      auVar16._4_4_ = auVar14._4_4_ * 0.70710677;
      auVar16._8_4_ = auVar14._8_4_ * 0.70710677;
      auVar16._12_4_ = auVar14._12_4_ * 0.70710677;
      auVar31 = vmovshdup_avx(auVar33);
      auVar15 = vaddss_avx512f(auVar33,auVar31);
      auVar17 = vshufps_avx(auVar16,auVar16,0xe1);
      auVar9 = vshufps_avx512vl(auVar9,auVar16,0x41);
      auVar38._0_4_ = auVar32._0_4_ + auVar17._0_4_;
      auVar38._4_4_ = auVar32._4_4_ + auVar17._4_4_;
      auVar38._8_4_ = auVar32._8_4_ + auVar17._8_4_;
      auVar38._12_4_ = auVar32._12_4_ + auVar17._12_4_;
      auVar14 = vsubps_avx(auVar18,auVar17);
      auVar16 = vpermt2ps_avx512vl(auVar18,auVar27,auVar32);
      auVar17 = vmovshdup_avx(auVar32);
      auVar15 = vsubss_avx512f(auVar17,auVar15);
      auVar30._0_4_ = auVar16._0_4_ + auVar16._0_4_;
      auVar30._4_4_ = auVar16._4_4_ + auVar16._4_4_;
      auVar30._8_4_ = auVar16._8_4_ + auVar16._8_4_;
      auVar30._12_4_ = auVar16._12_4_ + auVar16._12_4_;
      auVar17 = vblendps_avx(auVar38,auVar14,2);
      auVar16 = vsubps_avx512vl(auVar12,auVar13);
      auVar21 = vbroadcastss_avx512f
                          (ZEXT416((uint)((auVar18._0_4_ - auVar31._0_4_) + auVar33._0_4_)));
      auVar17 = vshufps_avx512vl(auVar8,auVar17,0x41);
      auVar22 = vbroadcastss_avx512f(auVar15);
      auVar14 = vsubps_avx512vl(auVar17,auVar9);
      auVar15._0_4_ = auVar17._0_4_ + auVar9._0_4_;
      auVar15._4_4_ = auVar17._4_4_ + auVar9._4_4_;
      auVar15._8_4_ = auVar17._8_4_ + auVar9._8_4_;
      auVar15._12_4_ = auVar17._12_4_ + auVar9._12_4_;
      auVar17 = vpermt2ps_avx512vl(auVar21._0_16_,auVar29,auVar22._0_16_);
      auVar18._0_8_ = auVar14._0_8_;
      auVar18._8_8_ = auVar15._8_8_;
      auVar31 = vsubps_avx(auVar30,auVar17);
      auVar8 = vaddps_avx512vl(auVar13,auVar12);
      auVar17._0_8_ = auVar10._0_8_;
      auVar17._8_8_ = auVar25._8_8_;
      auVar17 = vsubps_avx(auVar11,auVar17);
      auVar4._4_8_ = auVar11._8_8_;
      auVar4._0_4_ = auVar11._4_4_ + auVar11._4_4_;
      auVar9._0_8_ = auVar4._0_8_ << 0x20;
      auVar9._8_4_ = auVar11._8_4_ + auVar11._8_4_;
      auVar9._12_4_ = auVar11._12_4_ + auVar11._12_4_;
      auVar10._8_8_ = auVar9._8_8_;
      auVar10._0_8_ = auVar17._0_8_;
      auVar11 = vaddps_avx512vl(auVar14,auVar17);
      auVar14 = vsubps_avx(auVar10,auVar18);
      auVar17 = vblendps_avx(auVar14,auVar11,2);
      auVar23 = vinsertf32x4_avx512f
                          (ZEXT3264(CONCAT1616(auVar17,CONCAT88(auVar31._8_8_,auVar8._0_8_))),
                           auVar16,2);
      auVar24._0_40_ = auVar23._0_40_;
      auVar24._40_4_ = auVar21._40_4_;
      auVar24._44_4_ = auVar22._44_4_;
      auVar24._48_4_ = auVar23._48_4_;
      auVar24._52_4_ = auVar23._52_4_;
      auVar24._56_4_ = auVar23._56_4_;
      auVar24._60_4_ = auVar23._60_4_;
      auVar21 = vinsertf32x4_avx512f(auVar24,auVar11,3);
      vpermt2ps_avx512f(auVar21,auVar6,ZEXT1664(auVar14));
      auVar21 = vpermt2pd_avx512f(auVar7,ZEXT1664(auVar15));
      auVar21 = vmulps_avx512f(auVar21,auVar20);
      *(undefined1 (*) [64])ioptr = auVar21;
      ioptr = (float *)((long)ioptr + 0x40);
    }
    break;
  default:
    StageCnt = (M + -1) / 3;
    lVar1 = StageCnt * -3 + -1 + M;
    for (; 0 < Rows; Rows = Rows + -1) {
      scbitrevR2(ioptr,M,BRLow,scale);
      if (lVar1 == 2) {
        ibfR4(ioptr,M,2);
        lStack_60 = 8;
      }
      else {
        lStack_60 = 2;
        if (lVar1 == 1) {
          ibfR2(ioptr,M,NDiffU);
          lStack_60 = 4;
        }
      }
      if ((ulong)M < 0xc) {
        ibfstages(ioptr,M,Utbl,1,lStack_60,StageCnt);
      }
      else {
        ifftrecurs(ioptr,M,Utbl,1,lStack_60,StageCnt);
      }
      ioptr = ioptr + (2L << (M & 0x3fU));
    }
  }
  return;
}

Assistant:

void iffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place inverse complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;
const float scale = 1.0/POW2(M);

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		ifft2pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		ifft4pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		ifft8pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);	/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			ibfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			ifftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}